

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void ui_mouse(void)

{
  ImVec2 local_28;
  ImGuiIO *local_20;
  ImGuiIO *io;
  int local_10;
  int y;
  int x;
  uint btn;
  
  y = (a_app_state->pointer).buttons;
  local_10 = (a_app_state->pointer).x;
  io._4_4_ = (a_app_state->pointer).y;
  local_20 = ImGui::GetIO();
  ImVec2::ImVec2(&local_28,(float)local_10,(float)io._4_4_);
  local_20->MousePos = local_28;
  local_20->MouseDown[0] = (y & 1U) != 0;
  local_20->MouseDown[1] = (y & 2U) != 0;
  local_20->MouseDown[2] = (y & 4U) != 0;
  return;
}

Assistant:

void ui_mouse() {
	const unsigned int btn = a_app_state->pointer.buttons;
	const int x = a_app_state->pointer.x;
	const int y = a_app_state->pointer.y;
	ImGuiIO& io = ImGui::GetIO();
	io.MousePos = ImVec2((float)x, (float)y);
	io.MouseDown[0] = !!(btn & AB_Left);
	io.MouseDown[1] = !!(btn & AB_Right);
	io.MouseDown[2] = !!(btn & AB_Middle);
}